

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O3

size_t promptTextColumnLen(char *prompt,size_t plen)

{
  short *psVar1;
  byte *pbVar2;
  size_t off;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  size_t col_len;
  char buf [4096];
  long local_1030;
  undefined1 local_1028 [4096];
  
  if (plen != 0) {
    uVar3 = 0;
    uVar5 = 0;
    do {
      psVar1 = (short *)(prompt + uVar3);
      if ((plen - uVar3 < 3) || (*psVar1 != 0x5b1b)) {
LAB_0010b6b8:
        local_1028[uVar5] = (char)*psVar1;
        uVar5 = uVar5 + 1;
        uVar6 = 1;
      }
      else {
        uVar6 = 2;
        do {
          if (plen - uVar3 == uVar6) goto LAB_0010b6b8;
          pbVar2 = (byte *)((long)psVar1 + uVar6);
          uVar6 = uVar6 + 1;
          uVar7 = *pbVar2 - 0x41;
        } while ((0x2c < uVar7) || ((0x1020000c06ffU >> ((ulong)uVar7 & 0x3f) & 1) == 0));
      }
      uVar3 = uVar3 + uVar6;
    } while (uVar3 < plen);
    if (uVar5 != 0) {
      sVar8 = 0;
      uVar3 = 0;
      do {
        lVar4 = (*(code *)nextCharLen)(local_1028,uVar5,uVar3,&local_1030);
        uVar3 = uVar3 + lVar4;
        sVar8 = sVar8 + local_1030;
      } while (uVar3 < uVar5);
      return sVar8;
    }
  }
  return 0;
}

Assistant:

static size_t promptTextColumnLen(const char *prompt, size_t plen) {
    char buf[LINENOISE_MAX_LINE];
    size_t buf_len = 0;
    size_t off = 0;
    while (off < plen) {
        size_t len;
        if (isAnsiEscape(prompt + off, plen - off, &len)) {
            off += len;
            continue;
        }
        buf[buf_len++] = prompt[off++];
    }
    return columnPos(buf,buf_len,buf_len);
}